

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_basic.cpp
# Opt level: O0

basic * mpt::metatype::basic::create(char *src,int len)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  undefined4 local_38;
  void *ptr;
  basic *m;
  int post;
  int len_local;
  char *src_local;
  
  m._4_4_ = len;
  if (len < 0) {
    if (src == (char *)0x0) {
      local_38 = 0;
    }
    else {
      sVar2 = strlen(src);
      local_38 = (int)sVar2;
    }
    m._4_4_ = local_38;
  }
  iVar1 = _mpt_geninfo_size((long)m._4_4_);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    src_local = (char *)0x0;
  }
  else {
    src_local = (char *)malloc((long)iVar1 + 8);
    if ((basic *)src_local == (basic *)0x0) {
      src_local = (char *)0x0;
    }
    else {
      basic((basic *)src_local,(long)iVar1);
      set((basic *)src_local,src,m._4_4_);
    }
  }
  return (basic *)src_local;
}

Assistant:

metatype::basic *metatype::basic::create(const char *src, int len)
{
	if (len < 0) {
		len = src ? strlen(src) : 0;
	}
	int post;
	if ((post = _mpt_geninfo_size(len)) < 0) {
		errno = EINVAL;
		return 0;
	}
	basic *m;
	void *ptr;
	if (!(ptr = malloc(sizeof(*m) + post))) {
		return 0;
	}
	m = new (ptr) basic(post);
	m->set(src, len);
	return m;
}